

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O2

SVector<double,_3> * __thiscall
gmath::SMatrix<double,_3,_3>::operator*
          (SVector<double,_3> *__return_storage_ptr__,SMatrix<double,_3,_3> *this,
          SVector<double,_3> *a)

{
  int k;
  long lVar1;
  int i;
  long lVar2;
  double dVar3;
  
  SVector<double,_3>::SVector(__return_storage_ptr__);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    dVar3 = __return_storage_ptr__->v[lVar1];
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      dVar3 = dVar3 + (*(double (*) [3])*(double (*) [3])this)[lVar2] * a->v[lVar2];
    }
    __return_storage_ptr__->v[lVar1] = dVar3;
    this = (SMatrix<double,_3,_3> *)((long)this + 0x18);
  }
  return __return_storage_ptr__;
}

Assistant:

SVector<T, nrows> operator*(const SVector<T, ncols> &a) const
    {
      SVector<T, nrows> ret;

      for (int k=0; k<nrows; k++)
        for (int i=0; i<ncols; i++)
        {
          ret[k]+=v[k][i]*a[i];
        }

      return ret;
    }